

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

bool __thiscall Graph<Node>::operator==(Graph<Node> *this,Graph<Node> *other)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong in_R8;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  vector<Edge> v;
  vector<Edge> local_20;
  
  vector<Edge>::operator=(&local_20,&this->edges);
  std::__sort<Edge*,__gnu_cxx::__ops::_Iter_less_iter>();
  uVar4 = 1;
  lVar5 = 0;
  lVar6 = 0;
  while ((bVar3 = SUB81(uVar4,0), lVar6 < local_20._size && (bVar3 != false))) {
    uVar1 = *(undefined8 *)((long)&((other->edges).vect)->_nodeS + lVar5);
    uVar2 = *(undefined8 *)((long)&(local_20.vect)->_nodeS + lVar5);
    iVar8 = -(uint)((int)uVar2 == (int)uVar1);
    iVar9 = -(uint)((int)((ulong)uVar2 >> 0x20) == (int)((ulong)uVar1 >> 0x20));
    auVar7._4_4_ = iVar8;
    auVar7._0_4_ = iVar8;
    auVar7._8_4_ = iVar9;
    auVar7._12_4_ = iVar9;
    iVar8 = movmskpd((int)in_R8,auVar7);
    if ((iVar8 == 3) <= bVar3) {
      uVar4 = (ulong)(iVar8 == 3);
    }
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0xc;
    in_R8 = uVar4;
  }
  vector<Edge>::~vector(&local_20);
  return bVar3;
}

Assistant:

bool operator == (const Graph &other) const {
        vector <Edge> v = edges;
        std::sort(v.begin(), v.end());
//        v.mergeSort(0, v.size() - 1, [](Edge a, Edge b) {
//            return a < b;
//        });

        bool areEqual = true;
        for (int i = 0; i < v.size() and areEqual; ++i) {
            areEqual = min(areEqual, v[i] == other.getEdge(i));
        }

        return areEqual;
    }